

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

float __thiscall QByteArray::toFloat(QByteArray *this,bool *ok)

{
  long in_FS_OFFSET;
  float fVar1;
  double d;
  QByteArrayView local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.m_data = (this->d).ptr;
  local_20.m_size = (this->d).size;
  d = QByteArrayView::toDouble(&local_20,ok);
  fVar1 = QLocaleData::convertDoubleToFloat(d,ok);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return fVar1;
  }
  __stack_chk_fail();
}

Assistant:

float QByteArray::toFloat(bool *ok) const
{
    return QLocaleData::convertDoubleToFloat(toDouble(ok), ok);
}